

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

int __thiscall argparse::ArgumentParser::get<int>(ArgumentParser *this,string_view arg_name)

{
  int iVar1;
  logic_error *this_00;
  Argument *this_01;
  ArgumentParser *this_local;
  string_view arg_name_local;
  
  if ((this->m_is_parsed & 1U) == 0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Nothing parsed, no arguments are available.");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  this_01 = operator[](this,arg_name);
  iVar1 = Argument::get<int>(this_01);
  return iVar1;
}

Assistant:

T get(std::string_view arg_name) const {
    if (!m_is_parsed) {
      throw std::logic_error("Nothing parsed, no arguments are available.");
    }
    return (*this)[arg_name].get<T>();
  }